

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_make_synclo_op(sexp ctx,sexp self,sexp_sint_t n,sexp env,sexp fv,sexp expr)

{
  sexp psVar1;
  
  if ((((ulong)env & 3) == 0) && (env->tag == 0x17)) {
    if ((((uint)expr & 0xf) == 6) ||
       (((psVar1 = expr, ((ulong)expr & 3) == 0 && (expr->tag < 0x17)) &&
        ((0x4000c0U >> (expr->tag & 0x1f) & 1) != 0)))) {
      psVar1 = sexp_alloc_tagged_aux(ctx,0x28,0x16);
      (psVar1->value).type.name = env;
      (psVar1->value).type.cpl = fv;
      (psVar1->value).type.slots = expr;
      (psVar1->value).bytecode.length = 0x3e;
    }
    return psVar1;
  }
  psVar1 = sexp_type_exception(ctx,self,0x17,env);
  return psVar1;
}

Assistant:

sexp sexp_make_synclo_op (sexp ctx, sexp self, sexp_sint_t n, sexp env, sexp fv, sexp expr) {
  sexp res;
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
  if (! (sexp_symbolp(expr) || sexp_pairp(expr) || sexp_synclop(expr)))
    return expr;
  res = sexp_alloc_type(ctx, synclo, SEXP_SYNCLO);
  if (SEXP_USE_FLAT_SYNTACTIC_CLOSURES && sexp_synclop(expr)) {
    sexp_synclo_env(res) = sexp_synclo_env(expr);
    sexp_synclo_free_vars(res) = sexp_synclo_free_vars(expr);
    sexp_synclo_expr(res) = sexp_synclo_expr(expr);
    sexp_synclo_rename(res) = sexp_synclo_rename(expr);
  } else {
    sexp_synclo_env(res) = env;
    sexp_synclo_free_vars(res) = fv;
    sexp_synclo_expr(res) = expr;
    sexp_synclo_rename(res) = SEXP_FALSE;
  }
  return res;
}